

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O3

pboolean p_socket_io_condition_wait(PSocket *socket,PSocketIOCondition condition,PError **error)

{
  int iVar1;
  pint pVar2;
  PErrorIO code;
  char *message;
  int __timeout;
  pollfd local_20;
  
  if (socket == (PSocket *)0x0) {
    p_socket_io_condition_wait_cold_2();
  }
  else if ((socket->field_0x18 & 4) == 0) {
    local_20.fd = socket->fd;
    __timeout = -1;
    if (0 < socket->timeout) {
      __timeout = socket->timeout;
    }
    local_20.revents = 0;
    local_20.events = (ushort)(condition != P_SOCKET_IO_CONDITION_POLLIN) * 3 + 1;
    do {
      iVar1 = poll(&local_20,1,__timeout);
      if (iVar1 != -1) {
        if (iVar1 == 0) {
          pVar2 = p_error_get_last_net();
          message = "Timed out while waiting socket condition";
          code = P_ERROR_IO_TIMED_OUT;
          goto LAB_00115561;
        }
        if (iVar1 == 1) {
          return 1;
        }
        break;
      }
      pVar2 = p_error_get_last_net();
    } while (pVar2 == 4);
    pVar2 = p_error_get_last_net();
    code = p_error_get_io_from_system(pVar2);
    pVar2 = p_error_get_last_net();
    message = "Failed to call poll() on socket";
LAB_00115561:
    p_error_set_error_p(error,code,pVar2,message);
  }
  else {
    p_socket_io_condition_wait_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_socket_io_condition_wait (const PSocket	*socket,
			    PSocketIOCondition	condition,
			    PError		**error)
{
#if defined (P_OS_WIN)
	long	network_events;
	pint	evret;
	pint	timeout;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	timeout = socket->timeout > 0 ? socket->timeout : WSA_INFINITE;

	if (condition == P_SOCKET_IO_CONDITION_POLLIN)
		network_events = FD_READ | FD_ACCEPT;
	else
		network_events = FD_WRITE | FD_CONNECT;

	WSAResetEvent (socket->events);
	WSAEventSelect (socket->fd, socket->events, network_events);

	evret = WSAWaitForMultipleEvents (1, (const HANDLE *) &socket->events, TRUE, timeout, FALSE);

	if (evret == WSA_WAIT_EVENT_0)
		return TRUE;
	else if (evret == WSA_WAIT_TIMEOUT) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_TIMED_OUT,
				     (pint) p_error_get_last_net (),
				     "Timed out while waiting socket condition");
		return FALSE;
	} else {
		p_error_set_error_p (error,
				     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
				     (pint) p_error_get_last_net (),
				     "Failed to call WSAWaitForMultipleEvents() on socket");
		return FALSE;
	}
#elif defined (P_SOCKET_USE_POLL)
	struct pollfd	pfd;
	pint		evret;
	pint		timeout;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	timeout = socket->timeout > 0 ? socket->timeout : -1;

	pfd.fd = socket->fd;
	pfd.revents = 0;

	if (condition == P_SOCKET_IO_CONDITION_POLLIN)
		pfd.events = POLLIN;
	else
		pfd.events = POLLOUT;

#  ifdef P_OS_SCO
	p_time_profiler_reset (socket->timer);
#  endif

	while (TRUE) {
		evret = poll (&pfd, 1, timeout);

#  ifdef EINTR
		if (evret == -1 && p_error_get_last_net () == EINTR) {
#    ifdef P_OS_SCO
			if (timeout < 0 ||
			    (p_time_profiler_elapsed_usecs (socket->timer) / 1000) < (puint64) timeout)
				continue;
			else
				evret = 0;
#    else
			continue;
#    endif
		}
#  endif

		if (evret == 1)
			return TRUE;
		else if (evret == 0) {
			p_error_set_error_p (error,
					     (pint) P_ERROR_IO_TIMED_OUT,
					     (pint) p_error_get_last_net (),
					     "Timed out while waiting socket condition");
			return FALSE;
		} else {
			p_error_set_error_p (error,
					     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
					     (pint) p_error_get_last_net (),
					     "Failed to call poll() on socket");
			return FALSE;
		}
	}
#else
	fd_set			fds;
	struct timeval		tv;
	struct timeval *	ptv;
	pint			evret;

	if (P_UNLIKELY (socket == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (P_UNLIKELY (pp_socket_check (socket, error) == FALSE))
		return FALSE;

	if (socket->timeout > 0)
		ptv = &tv;
	else
		ptv = NULL;

	while (TRUE) {
		FD_ZERO (&fds);
		FD_SET (socket->fd, &fds);

		if (socket->timeout > 0) {
			tv.tv_sec  = socket->timeout / 1000;
			tv.tv_usec = (socket->timeout % 1000) * 1000;
		}

		if (condition == P_SOCKET_IO_CONDITION_POLLIN)
			evret = select (socket->fd + 1, &fds, NULL, NULL, ptv);
		else
			evret = select (socket->fd + 1, NULL, &fds, NULL, ptv);

#ifdef EINTR
		if (evret == -1 && p_error_get_last_net () == EINTR)
			continue;
#endif

		if (evret == 1)
			return TRUE;
		else if (evret == 0) {
			p_error_set_error_p (error,
					     (pint) P_ERROR_IO_TIMED_OUT,
					     (pint) p_error_get_last_net (),
					     "Timed out while waiting socket condition");
			return FALSE;
		} else {
			p_error_set_error_p (error,
					     (pint) p_error_get_io_from_system (p_error_get_last_net ()),
					     (pint) p_error_get_last_net (),
					     "Failed to call select() on socket");
			return FALSE;
		}
	}
#endif
}